

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O2

void av1_generate_block_2x2_hash_value
               (IntraBCHashInfo *intrabc_hash_info,YV12_BUFFER_CONFIG *picture,
               uint32_t **pic_block_hash,int8_t **pic_block_same_info)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int y_pos;
  int iVar7;
  ulong uVar8;
  uint8_t p [4];
  uint16_t p_1 [4];
  
  uVar2 = (picture->field_2).field_0.y_crop_width - 1;
  iVar6 = (picture->field_3).field_0.y_crop_height + -1;
  uVar8 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar8;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  if ((picture->flags & 8) == 0) {
    lVar5 = 0;
    for (iVar7 = 0; iVar7 != iVar6; iVar7 = iVar7 + 1) {
      lVar5 = (long)(int)lVar5;
      for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
        iVar1 = (picture->field_4).field_0.y_stride;
        get_pixels_in_1D_char_array_by_block_2x2
                  ((picture->field_5).buffers[0] + uVar8 + (long)(iVar7 * iVar1),iVar1,p);
        (*pic_block_same_info)[uVar8 + lVar5] = p[3] == p[2] && p[0] == p[1];
        pic_block_same_info[1][uVar8 + lVar5] = p[3] == p[1] && p[0] == p[2];
        uVar3 = av1_get_crc_value(&intrabc_hash_info->crc_calculator1,p,4);
        (*pic_block_hash)[lVar5 + uVar8] = uVar3;
        uVar3 = av1_get_crc_value(&intrabc_hash_info->crc_calculator2,p,4);
        pic_block_hash[1][lVar5 + uVar8] = uVar3;
      }
      lVar5 = lVar5 + uVar8 + 1;
    }
  }
  else {
    lVar5 = 0;
    while (iVar7 = (int)uVar8, iVar7 != iVar6) {
      lVar5 = (long)(int)lVar5;
      for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
        iVar1 = (picture->field_4).field_0.y_stride;
        get_pixels_in_1D_short_array_by_block_2x2
                  ((uint16_t *)
                   ((long)(iVar1 * iVar7) * 2 + (long)(picture->field_5).field_0.y_buffer * 2 +
                   uVar8 * 2),iVar1,p_1);
        (*pic_block_same_info)[lVar5] = p_1[3] == p_1[2] && p_1[0] == p_1[1];
        pic_block_same_info[1][lVar5] = p_1[3] == p_1[1] && p_1[0] == p_1[2];
        uVar3 = av1_get_crc_value(&intrabc_hash_info->crc_calculator1,(uint8_t *)p_1,8);
        (*pic_block_hash)[lVar5] = uVar3;
        uVar3 = av1_get_crc_value(&intrabc_hash_info->crc_calculator2,(uint8_t *)p_1,8);
        pic_block_hash[1][lVar5] = uVar3;
        lVar5 = lVar5 + 1;
      }
      lVar5 = lVar5 + 1;
      uVar8 = (ulong)(iVar7 + 1);
    }
  }
  return;
}

Assistant:

void av1_generate_block_2x2_hash_value(IntraBCHashInfo *intrabc_hash_info,
                                       const YV12_BUFFER_CONFIG *picture,
                                       uint32_t *pic_block_hash[2],
                                       int8_t *pic_block_same_info[3]) {
  const int width = 2;
  const int height = 2;
  const int x_end = picture->y_crop_width - width + 1;
  const int y_end = picture->y_crop_height - height + 1;
  CRC_CALCULATOR *calc_1 = &intrabc_hash_info->crc_calculator1;
  CRC_CALCULATOR *calc_2 = &intrabc_hash_info->crc_calculator2;

  const int length = width * 2;
  if (picture->flags & YV12_FLAG_HIGHBITDEPTH) {
    uint16_t p[4];
    int pos = 0;
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      for (int x_pos = 0; x_pos < x_end; x_pos++) {
        get_pixels_in_1D_short_array_by_block_2x2(
            CONVERT_TO_SHORTPTR(picture->y_buffer) + y_pos * picture->y_stride +
                x_pos,
            picture->y_stride, p);
        pic_block_same_info[0][pos] = is_block16_2x2_row_same_value(p);
        pic_block_same_info[1][pos] = is_block16_2x2_col_same_value(p);

        pic_block_hash[0][pos] =
            av1_get_crc_value(calc_1, (uint8_t *)p, length * sizeof(p[0]));
        pic_block_hash[1][pos] =
            av1_get_crc_value(calc_2, (uint8_t *)p, length * sizeof(p[0]));
        pos++;
      }
      pos += width - 1;
    }
  } else {
    uint8_t p[4];
    int pos = 0;
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      for (int x_pos = 0; x_pos < x_end; x_pos++) {
        get_pixels_in_1D_char_array_by_block_2x2(
            picture->y_buffer + y_pos * picture->y_stride + x_pos,
            picture->y_stride, p);
        pic_block_same_info[0][pos] = is_block_2x2_row_same_value(p);
        pic_block_same_info[1][pos] = is_block_2x2_col_same_value(p);

        pic_block_hash[0][pos] =
            av1_get_crc_value(calc_1, p, length * sizeof(p[0]));
        pic_block_hash[1][pos] =
            av1_get_crc_value(calc_2, p, length * sizeof(p[0]));
        pos++;
      }
      pos += width - 1;
    }
  }
}